

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry *
dnscache_add_addr(Curl_easy *data,Curl_dnscache *dnscache,Curl_addrinfo *addr,char *hostname,
                 size_t hostlen,int port,_Bool permanent)

{
  CURLcode CVar1;
  Curl_dns_entry *dns_00;
  size_t sVar2;
  time_t tVar3;
  CURLcode result;
  Curl_dns_entry *dns2;
  Curl_dns_entry *dns;
  size_t entry_len;
  char entry_id [262];
  _Bool permanent_local;
  size_t sStack_38;
  int port_local;
  size_t hostlen_local;
  char *hostname_local;
  Curl_addrinfo *addr_local;
  Curl_dnscache *dnscache_local;
  Curl_easy *data_local;
  
  entry_id[0x103] = permanent;
  unique0x10000191 = port;
  hostname_local = (char *)addr;
  addr_local = (Curl_addrinfo *)dnscache;
  dnscache_local = (Curl_dnscache *)data;
  if (((*(ulong *)&(data->set).field_0x894 >> 0x2e & 1) == 0) ||
     (CVar1 = Curl_shuffle_addr(data,(Curl_addrinfo **)&hostname_local), CVar1 == CURLE_OK)) {
    sStack_38 = hostlen;
    if (hostlen == 0) {
      sStack_38 = strlen(hostname);
    }
    dns_00 = (Curl_dns_entry *)(*Curl_ccalloc)(1,sStack_38 + 0x20);
    if (dns_00 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo((Curl_addrinfo *)hostname_local);
      data_local = (Curl_easy *)0x0;
    }
    else {
      sVar2 = create_dnscache_id(hostname,sStack_38,stack0xffffffffffffffc4,(char *)&entry_len,0x106
                                );
      dns_00->refcount = 1;
      dns_00->addr = (Curl_addrinfo *)hostname_local;
      if ((entry_id[0x103] & 1U) == 0) {
        tVar3 = time((time_t *)0x0);
        dns_00->timestamp = tVar3;
        if (dns_00->timestamp == 0) {
          dns_00->timestamp = 1;
        }
      }
      else {
        dns_00->timestamp = 0;
      }
      dns_00->hostport = stack0xffffffffffffffc4;
      if (sStack_38 != 0) {
        memcpy(dns_00->hostname,hostname,sStack_38);
      }
      data_local = (Curl_easy *)Curl_hash_add((Curl_hash *)addr_local,&entry_len,sVar2 + 1,dns_00);
      if (data_local == (Curl_easy *)0x0) {
        dnscache_entry_free(dns_00);
        data_local = (Curl_easy *)0x0;
      }
      else {
        data_local->mid = data_local->mid + 1;
      }
    }
  }
  else {
    Curl_freeaddrinfo((Curl_addrinfo *)hostname_local);
    data_local = (Curl_easy *)0x0;
  }
  return (Curl_dns_entry *)data_local;
}

Assistant:

static struct Curl_dns_entry *
dnscache_add_addr(struct Curl_easy *data,
                  struct Curl_dnscache *dnscache,
                  struct Curl_addrinfo *addr,
                  const char *hostname,
                  size_t hostlen, /* length or zero */
                  int port,
                  bool permanent)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result) {
      Curl_freeaddrinfo(addr);
      return NULL;
    }
  }
#endif
  if(!hostlen)
    hostlen = strlen(hostname);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry) + hostlen);
  if(!dns) {
    Curl_freeaddrinfo(addr);
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  entry_len = create_dnscache_id(hostname, hostlen, port,
                                 entry_id, sizeof(entry_id));

  dns->refcount = 1; /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  if(permanent)
    dns->timestamp = 0; /* an entry that never goes stale */
  else {
    dns->timestamp = time(NULL);
    if(dns->timestamp == 0)
      dns->timestamp = 1;
  }
  dns->hostport = port;
  if(hostlen)
    memcpy(dns->hostname, hostname, hostlen);

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(&dnscache->entries, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    dnscache_entry_free(dns);
    return NULL;
  }

  dns = dns2;
  dns->refcount++;         /* mark entry as in-use */
  return dns;
}